

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::emit(JSPrinter *this,char c)

{
  size_t sVar1;
  
  maybeSpace(this,c);
  if (((c == '}') && (this->pretty == false)) && (this->buffer[this->used - 1] == ';')) {
    this->used = this->used - 1;
  }
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = c;
  return;
}

Assistant:

void emit(char c) {
    maybeSpace(c);
    if (!pretty && c == '}' && buffer[used - 1] == ';') {
      used--; // optimize ;} into }, the ; is not separating anything
    }
    ensure(1);
    buffer[used++] = c;
  }